

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::AddDefineFlag(cmMakefile *this,string *flag)

{
  bool bVar1;
  ulong uVar2;
  string *flag_local;
  cmMakefile *this_local;
  
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    s_AddDefineFlag(flag,&this->DefineFlagsOrig);
    bVar1 = ParseDefineFlag(this,flag,false);
    if (!bVar1) {
      s_AddDefineFlag(flag,&this->DefineFlags);
    }
  }
  return;
}

Assistant:

void cmMakefile::AddDefineFlag(std::string const& flag)
{
  if (flag.empty()) {
    return;
  }

  // Update the string used for the old DEFINITIONS property.
  s_AddDefineFlag(flag, this->DefineFlagsOrig);

  // If this is really a definition, update COMPILE_DEFINITIONS.
  if (this->ParseDefineFlag(flag, false)) {
    return;
  }

  // Add this flag that does not look like a definition.
  s_AddDefineFlag(flag, this->DefineFlags);
}